

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putgreytile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  uint32_t **BWmap;
  uint32_t local_28;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar1 = img->samplesperpixel;
  ppuVar2 = img->BWmap;
  _y_local = cp;
  for (local_28 = h; w_local = w, local_28 != 0; local_28 = local_28 - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      *_y_local = *ppuVar2[*pp];
      pp = pp + (int)(uint)uVar1;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    pp = pp + fromskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putgreytile)
{
    int samplesperpixel = img->samplesperpixel;
    uint32_t **BWmap = img->BWmap;

    (void)y;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = BWmap[*pp][0];
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}